

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O0

Abc_Ntk_t * Io_ReadAiger(char *pFileName,int fCheck)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pAVar11;
  bool bVar12;
  int Counter;
  int Init;
  int RetValue;
  uint uLit;
  uint uLit1;
  uint uLit0;
  char *pType;
  char *pName;
  char *pCur;
  char *pSymbols;
  char *pDrivers;
  char *pContents;
  int local_98;
  int i;
  int nDigits;
  int iTerm;
  int nFileSize;
  int nFair;
  int nJust;
  int nConstr;
  int nBad;
  int nAnds;
  int nLatches;
  int nOutputs;
  int nInputs;
  int nTotal;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pObj;
  Vec_Int_t *vLits;
  Vec_Ptr_t *vTerms;
  Vec_Ptr_t *vNodes;
  FILE *pFile;
  ProgressBar *pProgress;
  char *pcStack_18;
  int fCheck_local;
  char *pFileName_local;
  
  pObj = (Abc_Obj_t *)0x0;
  nJust = 0;
  nFair = 0;
  nFileSize = 0;
  iTerm = 0;
  nDigits = -1;
  pSymbols = (char *)0x0;
  pProgress._4_4_ = fCheck;
  pcStack_18 = pFileName;
  sVar7 = strlen(pFileName);
  iVar3 = strncmp(pFileName + (sVar7 - 4),".bz2",4);
  pcVar8 = pcStack_18;
  if (iVar3 == 0) {
    pDrivers = Ioa_ReadLoadFileBz2Aig(pcStack_18,&nDigits);
  }
  else {
    sVar7 = strlen(pcStack_18);
    iVar3 = strncmp(pcVar8 + (sVar7 - 3),".gz",3);
    if (iVar3 == 0) {
      pDrivers = Ioa_ReadLoadFileGzAig(pcStack_18,&nDigits);
    }
    else {
      nDigits = Extra_FileSize(pcStack_18);
      vNodes = (Vec_Ptr_t *)fopen(pcStack_18,"rb");
      pDrivers = (char *)malloc((long)nDigits);
      fread(pDrivers,(long)nDigits,1,(FILE *)vNodes);
      fclose((FILE *)vNodes);
    }
  }
  iVar3 = strncmp(pDrivers,"aig",3);
  if ((iVar3 == 0) && ((pDrivers[3] == ' ' || (pDrivers[3] == '2')))) {
    for (pName = pDrivers; *pName != ' '; pName = pName + 1) {
    }
    pName = pName + 1;
    nOutputs = atoi(pName);
    for (; *pName != ' '; pName = pName + 1) {
    }
    pName = pName + 1;
    nLatches = atoi(pName);
    for (; *pName != ' '; pName = pName + 1) {
    }
    pName = pName + 1;
    nBad = atoi(pName);
    for (; *pName != ' '; pName = pName + 1) {
    }
    pName = pName + 1;
    nAnds = atoi(pName);
    for (; *pName != ' '; pName = pName + 1) {
    }
    pName = pName + 1;
    nConstr = atoi(pName);
    while( true ) {
      bVar12 = false;
      if (*pName != ' ') {
        bVar12 = *pName != '\n';
      }
      if (!bVar12) break;
      pName = pName + 1;
    }
    if (*pName == ' ') {
      pName = pName + 1;
      nJust = atoi(pName);
      while( true ) {
        bVar12 = false;
        if (*pName != ' ') {
          bVar12 = *pName != '\n';
        }
        if (!bVar12) break;
        pName = pName + 1;
      }
      nAnds = nJust + nAnds;
    }
    if (*pName == ' ') {
      pName = pName + 1;
      nFair = atoi(pName);
      while( true ) {
        bVar12 = false;
        if (*pName != ' ') {
          bVar12 = *pName != '\n';
        }
        if (!bVar12) break;
        pName = pName + 1;
      }
      nAnds = nFair + nAnds;
    }
    if (*pName == ' ') {
      pName = pName + 1;
      nFileSize = atoi(pName);
      while( true ) {
        bVar12 = false;
        if (*pName != ' ') {
          bVar12 = *pName != '\n';
        }
        if (!bVar12) break;
        pName = pName + 1;
      }
      nAnds = nFileSize + nAnds;
    }
    if (*pName == ' ') {
      pName = pName + 1;
      iTerm = atoi(pName);
      while( true ) {
        bVar12 = false;
        if (*pName != ' ') {
          bVar12 = *pName != '\n';
        }
        if (!bVar12) break;
        pName = pName + 1;
      }
      nAnds = iTerm + nAnds;
    }
    if (*pName == '\n') {
      pName = pName + 1;
      if (nOutputs == nLatches + nBad + nConstr) {
        if ((nFileSize == 0) && (iTerm == 0)) {
          if (nFair != 0) {
            if (nFair == 1) {
              fprintf(_stdout,"Warning: The last output is interpreted as a constraint.\n");
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",
                      (ulong)(uint)nFair);
            }
          }
          _nInputs = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
          pcVar8 = Extra_FileNameGeneric(pcStack_18);
          pcVar9 = Extra_UtilStrsav(pcVar8);
          _nInputs->pName = pcVar9;
          pcVar9 = Extra_UtilStrsav(pcStack_18);
          _nInputs->pSpec = pcVar9;
          if (pcVar8 != (char *)0x0) {
            free(pcVar8);
          }
          _nInputs->nConstrs = nFair;
          pVVar10 = Vec_PtrAlloc(nLatches + 1 + nBad + nConstr);
          vTerms = pVVar10;
          pAVar11 = Abc_AigConst1(_nInputs);
          pAVar11 = Abc_ObjNot(pAVar11);
          Vec_PtrPush(pVVar10,pAVar11);
          for (pContents._4_4_ = 0; (int)pContents._4_4_ < nLatches;
              pContents._4_4_ = pContents._4_4_ + 1) {
            pNode0 = Abc_NtkCreatePi(_nInputs);
            Vec_PtrPush(vTerms,pNode0);
          }
          for (pContents._4_4_ = 0; (int)pContents._4_4_ < nAnds;
              pContents._4_4_ = pContents._4_4_ + 1) {
            pNode0 = Abc_NtkCreatePo(_nInputs);
          }
          local_98 = Abc_Base10Log(nBad);
          for (pContents._4_4_ = 0; (int)pContents._4_4_ < nBad;
              pContents._4_4_ = pContents._4_4_ + 1) {
            pNode0 = Abc_NtkCreateLatch(_nInputs);
            Abc_LatchSetInit0(pNode0);
            pNode1 = Abc_NtkCreateBi(_nInputs);
            pNtkNew = (Abc_Ntk_t *)Abc_NtkCreateBo(_nInputs);
            Abc_ObjAddFanin(pNode0,pNode1);
            Abc_ObjAddFanin((Abc_Obj_t *)pNtkNew,pNode0);
            Vec_PtrPush(vTerms,pNtkNew);
          }
          if (pDrivers[3] == ' ') {
            pSymbols = pName;
            pContents._4_4_ = 0;
            while ((int)pContents._4_4_ < nBad + nAnds) {
              pcVar8 = pName + 1;
              cVar1 = *pName;
              pName = pcVar8;
              if (cVar1 == '\n') {
                pContents._4_4_ = pContents._4_4_ + 1;
              }
            }
          }
          else {
            pObj = (Abc_Obj_t *)Io_WriteDecodeLiterals(&pName,nBad + nAnds);
          }
          pFile = (FILE *)Extra_ProgressBarStart((FILE *)_stdout,nConstr);
          for (pContents._4_4_ = 0; (int)pContents._4_4_ < nConstr;
              pContents._4_4_ = pContents._4_4_ + 1) {
            Extra_ProgressBarUpdate((ProgressBar *)pFile,pContents._4_4_,(char *)0x0);
            iVar3 = pContents._4_4_ + 1 + nLatches + nBad;
            uVar4 = Io_ReadAigerDecode(&pName);
            uVar4 = iVar3 * 2 - uVar4;
            uVar5 = Io_ReadAigerDecode(&pName);
            pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,uVar4 - uVar5 >> 1);
            pNode1 = Abc_ObjNotCond(pAVar11,uVar4 - uVar5 & 1);
            pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,uVar4 >> 1);
            pNtkNew = (Abc_Ntk_t *)Abc_ObjNotCond(pAVar11,uVar4 & 1);
            iVar3 = Vec_PtrSize(vTerms);
            pVVar10 = vTerms;
            if (iVar3 != pContents._4_4_ + 1 + nLatches + nBad) {
              __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                            ,0x199,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
            }
            pAVar11 = Abc_AigAnd((Abc_Aig_t *)_nInputs->pManFunc,pNode1,(Abc_Obj_t *)pNtkNew);
            Vec_PtrPush(pVVar10,pAVar11);
          }
          Extra_ProgressBarStop((ProgressBar *)pFile);
          pCur = pName;
          pName = pSymbols;
          if (pDrivers[3] == ' ') {
            for (pContents._4_4_ = 0; uVar4 = pContents._4_4_, iVar3 = Vec_PtrSize(_nInputs->vBoxes)
                , (int)uVar4 < iVar3; pContents._4_4_ = pContents._4_4_ + 1) {
              pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
              iVar3 = Abc_ObjIsLatch(pAVar11);
              if (iVar3 != 0) {
                pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                pNode0 = Abc_ObjFanin0(pAVar11);
                uVar4 = atoi(pName);
                while( true ) {
                  bVar12 = false;
                  if (*pName != ' ') {
                    bVar12 = *pName != '\n';
                  }
                  if (!bVar12) break;
                  pName = pName + 1;
                }
                if (*pName == ' ') {
                  pName = pName + 1;
                  iVar3 = atoi(pName);
                  if (iVar3 == 0) {
                    pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                    Abc_LatchSetInit0(pAVar11);
                  }
                  else if (iVar3 == 1) {
                    pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                    Abc_LatchSetInit1(pAVar11);
                  }
                  else {
                    iVar6 = Abc_NtkPiNum(_nInputs);
                    iVar6 = Abc_Var2Lit(iVar6 + 1 + pContents._4_4_,0);
                    if (iVar3 != iVar6) {
                      __assert_fail("Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                                    ,0x1b3,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
                    }
                    pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                    Abc_LatchSetInitDc(pAVar11);
                  }
                  while( true ) {
                    bVar12 = false;
                    if (*pName != ' ') {
                      bVar12 = *pName != '\n';
                    }
                    if (!bVar12) break;
                    pName = pName + 1;
                  }
                }
                if (*pName != '\n') {
                  fprintf(_stdout,"The initial value of latch number %d is not recongnized.\n",
                          (ulong)pContents._4_4_);
                  return (Abc_Ntk_t *)0x0;
                }
                pName = pName + 1;
                pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,uVar4 >> 1);
                pNode1 = Abc_ObjNotCond(pAVar11,uVar4 & 1);
                Abc_ObjAddFanin(pNode0,pNode1);
              }
            }
            for (pContents._4_4_ = 0; iVar3 = pContents._4_4_, iVar6 = Abc_NtkPoNum(_nInputs),
                iVar3 < iVar6; pContents._4_4_ = pContents._4_4_ + 1) {
              pNode0 = Abc_NtkPo(_nInputs,pContents._4_4_);
              uVar4 = atoi(pName);
              do {
                pcVar8 = pName + 1;
                cVar1 = *pName;
                pName = pcVar8;
              } while (cVar1 != '\n');
              pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,uVar4 >> 1);
              pNode1 = Abc_ObjNotCond(pAVar11,uVar4 & 1);
              Abc_ObjAddFanin(pNode0,pNode1);
            }
          }
          else {
            for (pContents._4_4_ = 0; iVar3 = pContents._4_4_, iVar6 = Vec_PtrSize(_nInputs->vBoxes)
                , iVar3 < iVar6; pContents._4_4_ = pContents._4_4_ + 1) {
              pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
              iVar3 = Abc_ObjIsLatch(pAVar11);
              if (iVar3 != 0) {
                pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                pNode0 = Abc_ObjFanin0(pAVar11);
                uVar4 = Vec_IntEntry((Vec_Int_t *)pObj,pContents._4_4_);
                pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,uVar4 >> 1);
                pNode1 = Abc_ObjNotCond(pAVar11,uVar4 & 1);
                Abc_ObjAddFanin(pNode0,pNode1);
              }
            }
            for (pContents._4_4_ = 0; iVar3 = pContents._4_4_, iVar6 = Abc_NtkPoNum(_nInputs),
                iVar3 < iVar6; pContents._4_4_ = pContents._4_4_ + 1) {
              pNode0 = Abc_NtkPo(_nInputs,pContents._4_4_);
              pAVar11 = pObj;
              iVar3 = pContents._4_4_;
              iVar6 = Abc_NtkLatchNum(_nInputs);
              uVar4 = Vec_IntEntry((Vec_Int_t *)pAVar11,iVar3 + iVar6);
              pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(vTerms,uVar4 >> 1);
              pNode1 = Abc_ObjNotCond(pAVar11,uVar4 & 1);
              Abc_ObjAddFanin(pNode0,pNode1);
            }
            Vec_IntFree((Vec_Int_t *)pObj);
          }
          pName = pCur;
          if ((pCur < pDrivers + nDigits) && (*pCur != 'c')) {
            while( true ) {
              pcVar8 = pName;
              bVar12 = false;
              if (pName < pDrivers + nDigits) {
                bVar12 = *pName != 'c';
              }
              if (!bVar12) {
                for (pContents._4_4_ = 0; iVar3 = pContents._4_4_, iVar6 = Abc_NtkPiNum(_nInputs),
                    iVar3 < iVar6; pContents._4_4_ = pContents._4_4_ + 1) {
                  pAVar11 = Abc_NtkPi(_nInputs,pContents._4_4_);
                  pNode0 = pAVar11;
                  if ((pAVar11->field_6).pTemp == (void *)0x0) {
                    pcVar8 = Abc_ObjName(pAVar11);
                    Abc_ObjAssignName(pAVar11,pcVar8,(char *)0x0);
                  }
                }
                for (pContents._4_4_ = 0; iVar3 = pContents._4_4_,
                    iVar6 = Vec_PtrSize(_nInputs->vBoxes), iVar3 < iVar6;
                    pContents._4_4_ = pContents._4_4_ + 1) {
                  pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                  iVar3 = Abc_ObjIsLatch(pAVar11);
                  if (iVar3 != 0) {
                    pAVar11 = Abc_NtkBox(_nInputs,pContents._4_4_);
                    pAVar11 = Abc_ObjFanout0(pAVar11);
                    pNode0 = pAVar11;
                    if ((pAVar11->field_6).pTemp == (void *)0x0) {
                      pcVar8 = Abc_ObjName(pAVar11);
                      Abc_ObjAssignName(pAVar11,pcVar8,(char *)0x0);
                      pAVar11 = Abc_ObjFanin0(pNode0);
                      pcVar8 = Abc_ObjName(pNode0);
                      Abc_ObjAssignName(pAVar11,pcVar8,"L");
                      pAVar11 = Abc_ObjFanin0(pNode0);
                      pAVar11 = Abc_ObjFanin0(pAVar11);
                      pcVar8 = Abc_ObjName(pNode0);
                      Abc_ObjAssignName(pAVar11,pcVar8,"_in");
                    }
                  }
                }
                for (pContents._4_4_ = 0; iVar3 = pContents._4_4_, iVar6 = Abc_NtkPoNum(_nInputs),
                    iVar3 < iVar6; pContents._4_4_ = pContents._4_4_ + 1) {
                  pAVar11 = Abc_NtkPo(_nInputs,pContents._4_4_);
                  pNode0 = pAVar11;
                  if ((pAVar11->field_6).pTemp == (void *)0x0) {
                    pcVar8 = Abc_ObjName(pAVar11);
                    Abc_ObjAssignName(pAVar11,pcVar8,(char *)0x0);
                  }
                }
                goto LAB_00b237bb;
              }
              if (*pName == 'i') {
                vLits = (Vec_Int_t *)_nInputs->vPis;
              }
              else if (*pName == 'l') {
                vLits = (Vec_Int_t *)_nInputs->vBoxes;
              }
              else {
                if ((((*pName != 'o') && (*pName != 'b')) && (*pName != 'c')) &&
                   ((*pName != 'j' && (*pName != 'f')))) {
                  return (Abc_Ntk_t *)0x0;
                }
                vLits = (Vec_Int_t *)_nInputs->vPos;
              }
              pName = pName + 1;
              iVar3 = atoi(pName);
              do {
                pcVar9 = pName + 1;
                cVar1 = *pName;
                pName = pcVar9;
              } while (cVar1 != ' ');
              i = iVar3;
              iVar6 = Vec_PtrSize((Vec_Ptr_t *)vLits);
              if (iVar6 <= iVar3) break;
              pNode0 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vLits,i);
              pcVar2 = pName;
              pcVar9 = pName;
              if (*pcVar8 == 'l') {
                pNode0 = Abc_ObjFanout0(pNode0);
                pcVar2 = pName;
                pcVar9 = pName;
              }
              do {
                pName = pcVar2;
                pcVar2 = pName + 1;
              } while (*pName != '\n');
              *pName = '\0';
              pName = pName + 1;
              Abc_ObjAssignName(pNode0,pcVar9,(char *)0x0);
              if (*pcVar8 == 'l') {
                pAVar11 = Abc_ObjFanin0(pNode0);
                pcVar8 = Abc_ObjName(pNode0);
                Abc_ObjAssignName(pAVar11,pcVar8,"L");
                pAVar11 = Abc_ObjFanin0(pNode0);
                pAVar11 = Abc_ObjFanin0(pAVar11);
                pcVar8 = Abc_ObjName(pNode0);
                Abc_ObjAssignName(pAVar11,pcVar8,"_in");
              }
              pcVar8 = Abc_ObjName(pNode0);
              (pNode0->field_6).pTemp = pcVar8;
            }
            fprintf(_stdout,"The number of terminal is out of bound.\n");
            pFileName_local = (char *)0x0;
          }
          else {
            Abc_NtkShortNames(_nInputs);
LAB_00b237bb:
            pName = pCur;
            if (((pCur + 1 < pDrivers + nDigits) && (*pCur == 'c')) &&
               (pName = pCur + 1, *pName == 'n')) {
              pName = pCur + 2;
              sVar7 = strlen(pName);
              if (sVar7 != 0) {
                if (_nInputs->pName != (char *)0x0) {
                  free(_nInputs->pName);
                  _nInputs->pName = (char *)0x0;
                }
                pcVar8 = Extra_UtilStrsav(pName);
                _nInputs->pName = pcVar8;
              }
            }
            if (pDrivers != (char *)0x0) {
              free(pDrivers);
              pDrivers = (char *)0x0;
            }
            Vec_PtrFree(vTerms);
            Abc_AigCleanup((Abc_Aig_t *)_nInputs->pManFunc);
            if (((nJust != 0) || (nFair != 0)) || ((nFileSize != 0 || (iTerm != 0)))) {
              Abc_NtkInvertConstraints(_nInputs);
            }
            if ((pProgress._4_4_ == 0) || (iVar3 = Abc_NtkCheckRead(_nInputs), iVar3 != 0)) {
              pFileName_local = (char *)_nInputs;
            }
            else {
              printf("Io_ReadAiger: The network check has failed.\n");
              Abc_NtkDelete(_nInputs);
              pFileName_local = (char *)0x0;
            }
          }
        }
        else {
          fprintf(_stdout,
                  "Reading AIGER files with liveness properties is currently not supported.\n");
          if (pDrivers != (char *)0x0) {
            free(pDrivers);
          }
          pFileName_local = (char *)0x0;
        }
      }
      else {
        fprintf(_stdout,"The number of objects does not match.\n");
        if (pDrivers != (char *)0x0) {
          free(pDrivers);
        }
        pFileName_local = (char *)0x0;
      }
    }
    else {
      fprintf(_stdout,"The parameter line is in a wrong format.\n");
      if (pDrivers != (char *)0x0) {
        free(pDrivers);
      }
      pFileName_local = (char *)0x0;
    }
  }
  else {
    fprintf(_stdout,"Wrong input file format.\n");
    if (pDrivers != (char *)0x0) {
      free(pDrivers);
    }
    pFileName_local = (char *)0x0;
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

Abc_Ntk_t * Io_ReadAiger( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes, * vTerms;
    Vec_Int_t * vLits = NULL;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    int nFileSize = -1, iTerm, nDigits, i;
    char * pContents, * pDrivers = NULL, * pSymbols, * pCur, * pName, * pType;
    unsigned uLit0, uLit1, uLit;
    int RetValue;

    // read the file into the buffer
    if ( !strncmp(pFileName+strlen(pFileName)-4,".bz2",4) )
        pContents = Ioa_ReadLoadFileBz2Aig( pFileName, &nFileSize );
    else if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) )
        pContents = Ioa_ReadLoadFileGzAig( pFileName, &nFileSize );
    else
    {
//        pContents = Ioa_ReadLoadFile( pFileName );
        nFileSize = Extra_FileSize( pFileName );
        pFile = fopen( pFileName, "rb" );
        pContents = ABC_ALLOC( char, nFileSize );
        RetValue = fread( pContents, nFileSize, 1, pFile );
        fclose( pFile );
    }


    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
//        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties is currently not supported.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pName = Extra_FileNameGeneric( pFileName );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );
    ABC_FREE( pName );
    pNtkNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_ObjNot( Abc_AigConst1(pNtkNew) ) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
    }
    // create the latches
    nDigits = Abc_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Abc_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
    

    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // remember the beginning of latch/PO literals
        pDrivers = pCur;
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    { 
        vLits = Io_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Io_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Io_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    pCur = pDrivers;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
            if ( *pCur == ' ' ) // read initial value
            {
                int Init;
                pCur++;
                Init = atoi( pCur );
                if ( Init == 0 )
                    Abc_LatchSetInit0( Abc_NtkBox(pNtkNew, i) );
                else if ( Init == 1 )
                    Abc_LatchSetInit1( Abc_NtkBox(pNtkNew, i) );
                else 
                {
                    assert( Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0) ); 
                    // unitialized value of the latch is the latch literal according to http://fmv.jku.at/hwmcc11/beyond1.pdf
                    Abc_LatchSetInitDc( Abc_NtkBox(pNtkNew, i) );
                }
                while ( *pCur != ' ' && *pCur != '\n' ) pCur++;
            }
            if ( *pCur != '\n' )
            {
                fprintf( stdout, "The initial value of latch number %d is not recongnized.\n", i );
                return NULL;
            }
            pCur++;

            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
    }
    else
    {
        // read the latch driver literals
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i+Abc_NtkLatchNum(pNtkNew) );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        Vec_IntFree( vLits );
    }
 
    // read the names if present
    pCur = pSymbols;
    if ( pCur < pContents + nFileSize && *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNtkNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNtkNew->vBoxes;
            else if ( *pCur == 'o' || *pCur == 'b' || *pCur == 'c' || *pCur == 'j' || *pCur == 'f' )
                vTerms = pNtkNew->vPos;
            else
            {
//                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = (Abc_Obj_t *)Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Abc_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Abc_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
                Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
        } 

        // assign the remaining names
        Abc_NtkForEachPi( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
        Abc_NtkForEachLatchOutput( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
            Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            Counter++;
        }
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
//        if ( Counter )
//            printf( "Io_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Io_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Abc_NtkShortNames( pNtkNew );
    }

    // read the name of the model if given
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            if ( strlen(pCur) > 0 )
            {
                ABC_FREE( pNtkNew->pName );
                pNtkNew->pName = Extra_UtilStrsav( pCur );
            }
        }
    }

    // skipping the comments
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Abc_NtkInvertConstraints( pNtkNew );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadAiger: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}